

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O2

void Tests::AddExpressionEvaluionFail(char *reason)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  ulong uVar6;
  
  uVar1 = expressionEvaluionFails;
  uVar6 = (ulong)expressionEvaluionFails;
  lVar2 = 0;
  do {
    lVar5 = lVar2;
    if (uVar6 * 0x10 + 0x10 == lVar5 + 0x10) {
      if (uVar1 < 0x80) {
        pcVar4 = strdup(reason);
        (&expressionEvaluionFailInfo)[uVar6 * 2] = pcVar4;
        (&DAT_003e9eb8)[uVar6 * 4] = 1;
        expressionEvaluionFails = uVar1 + 1;
        return;
      }
      __assert_fail("expressionEvaluionFails < 128",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/tests/TestBase.cpp"
                    ,0xd5,"void Tests::AddExpressionEvaluionFail(const char *)");
    }
    iVar3 = strcmp(*(char **)((long)&expressionEvaluionFailInfo + lVar5),reason);
    lVar2 = lVar5 + 0x10;
  } while (iVar3 != 0);
  *(int *)((long)&DAT_003e9eb8 + lVar5) = *(int *)((long)&DAT_003e9eb8 + lVar5) + 1;
  return;
}

Assistant:

void AddExpressionEvaluionFail(const char *reason)
	{
		for(unsigned i = 0; i < expressionEvaluionFails; i++)
		{
			if(strcmp(expressionEvaluionFailInfo[i].reason, reason) == 0)
			{
				expressionEvaluionFailInfo[i].count++;
				return;
			}
		}
		assert(expressionEvaluionFails < 128);

		if(expressionEvaluionFails < 128)
		{
			expressionEvaluionFailInfo[expressionEvaluionFails].reason = strdup(reason);
			expressionEvaluionFailInfo[expressionEvaluionFails].count = 1;
			expressionEvaluionFails++;
		}
	}